

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot_playground.cpp
# Opt level: O0

void __thiscall transition::fix_names(transition *this)

{
  string local_38 [32];
  long local_18;
  size_t pos;
  transition *this_local;
  
  pos = (size_t)this;
  fix_name(this,&this->state_from);
  fix_name(this,&this->state_to);
  local_18 = std::__cxx11::string::rfind((char)this + '@',0x3a);
  if (local_18 != -1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)&this->label);
    std::__cxx11::string::operator=((string *)&this->label,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void fix_names()
    {
        fix_name(state_from);
        fix_name(state_to);
        const size_t pos = label.rfind(':');
        if (pos != std::string::npos) {
            label = label.substr(pos+1);
        }
    }